

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::DockBuilderSplitNode
                  (ImGuiID id,ImGuiDir split_dir,float size_ratio_for_node_at_dir,
                  ImGuiID *out_id_at_dir,ImGuiID *out_id_at_opposite_dir)

{
  ImGuiID IVar1;
  ImGuiID IVar2;
  ImGuiContext_conflict1 *ctx;
  ImGuiDockNode *pIVar3;
  bool bVar4;
  float fVar5;
  ImGuiDockRequest req;
  ImGuiDockRequest local_88;
  float local_48;
  
  ctx = GImGui;
  local_48 = size_ratio_for_node_at_dir;
  if (split_dir == -1) {
    __assert_fail("split_dir != ImGuiDir_None",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3d4b,
                  "ImGuiID ImGui::DockBuilderSplitNode(ImGuiID, ImGuiDir, float, ImGuiID *, ImGuiID *)"
                 );
  }
  pIVar3 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(GImGui->DockContext).Nodes,id);
  if (pIVar3 != (ImGuiDockNode *)0x0) {
    if (pIVar3->ChildNodes[0] == (ImGuiDockNode *)0x0) {
      local_88.UndockTargetWindow = (ImGuiWindow_conflict *)0x0;
      local_88.UndockTargetNode = (ImGuiDockNode *)0x0;
      local_88.DockSplitOuter = false;
      local_88.Type = ImGuiDockRequestType_Split;
      local_88.DockTargetWindow = (ImGuiWindow_conflict *)0x0;
      local_88.DockPayload = (ImGuiWindow_conflict *)0x0;
      bVar4 = (split_dir & 0xfffffffdU) == 0;
      fVar5 = local_48;
      if (!bVar4) {
        fVar5 = 1.0 - local_48;
      }
      local_88.DockSplitRatio = 1.0;
      if (fVar5 <= 1.0) {
        local_88.DockSplitRatio = fVar5;
      }
      local_88.DockSplitRatio = (float)(~-(uint)(fVar5 < 0.0) & (uint)local_88.DockSplitRatio);
      local_88.DockTargetNode = pIVar3;
      local_88.DockSplitDir = split_dir;
      DockContextProcessDock(ctx,&local_88);
      IVar1 = pIVar3->ChildNodes[!bVar4]->ID;
      IVar2 = pIVar3->ChildNodes[bVar4]->ID;
      if (out_id_at_dir != (ImGuiID *)0x0) {
        *out_id_at_dir = IVar1;
      }
      if (out_id_at_opposite_dir != (ImGuiID *)0x0) {
        *out_id_at_opposite_dir = IVar2;
      }
      return IVar1;
    }
    __assert_fail("!node->IsSplitNode()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3d55,
                  "ImGuiID ImGui::DockBuilderSplitNode(ImGuiID, ImGuiDir, float, ImGuiID *, ImGuiID *)"
                 );
  }
  __assert_fail("node != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x3d51,
                "ImGuiID ImGui::DockBuilderSplitNode(ImGuiID, ImGuiDir, float, ImGuiID *, ImGuiID *)"
               );
}

Assistant:

ImGuiID ImGui::DockBuilderSplitNode(ImGuiID id, ImGuiDir split_dir, float size_ratio_for_node_at_dir, ImGuiID* out_id_at_dir, ImGuiID* out_id_at_opposite_dir)
{
    ImGuiContext* ctx = GImGui;
    IM_ASSERT(split_dir != ImGuiDir_None);
    IMGUI_DEBUG_LOG_DOCKING("DockBuilderSplitNode node 0x%08X, split_dir %d\n", id, split_dir);

    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (node == NULL)
    {
        IM_ASSERT(node != NULL);
        return 0;
    }

    IM_ASSERT(!node->IsSplitNode()); // Assert if already Split

    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Split;
    req.DockTargetWindow = NULL;
    req.DockTargetNode = node;
    req.DockPayload = NULL;
    req.DockSplitDir = split_dir;
    req.DockSplitRatio = ImSaturate((split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? size_ratio_for_node_at_dir : 1.0f - size_ratio_for_node_at_dir);
    req.DockSplitOuter = false;
    DockContextProcessDock(ctx, &req);

    ImGuiID id_at_dir = node->ChildNodes[(split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? 0 : 1]->ID;
    ImGuiID id_at_opposite_dir = node->ChildNodes[(split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? 1 : 0]->ID;
    if (out_id_at_dir)
        *out_id_at_dir = id_at_dir;
    if (out_id_at_opposite_dir)
        *out_id_at_opposite_dir = id_at_opposite_dir;
    return id_at_dir;
}